

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemCopy(Mem *pTo,Mem *pFrom)

{
  ushort uVar1;
  char *pcVar2;
  u16 uVar3;
  u8 uVar4;
  u8 uVar5;
  ushort uVar6;
  int iVar7;
  
  if ((pTo->flags & 0x9000) != 0) {
    vdbeMemClearExternAndSetNull(pTo);
  }
  uVar3 = pFrom->flags;
  uVar4 = pFrom->enc;
  uVar5 = pFrom->eSubtype;
  pTo->n = pFrom->n;
  pTo->flags = uVar3;
  pTo->enc = uVar4;
  pTo->eSubtype = uVar5;
  pcVar2 = pFrom->z;
  pTo->u = pFrom->u;
  pTo->z = pcVar2;
  uVar1 = pTo->flags;
  uVar6 = uVar1 & 0xefff;
  pTo->flags = uVar6;
  if (((uVar1 & 0x12) != 0) && ((pFrom->flags & 0x2000) == 0)) {
    pTo->flags = uVar6 | 0x4000;
    iVar7 = sqlite3VdbeMemMakeWriteable(pTo);
    return iVar7;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCopy(Mem *pTo, const Mem *pFrom){
  int rc = SQLITE_OK;

  assert( !sqlite3VdbeMemIsRowSet(pFrom) );
  if( VdbeMemDynamic(pTo) ) vdbeMemClearExternAndSetNull(pTo);
  memcpy(pTo, pFrom, MEMCELLSIZE);
  pTo->flags &= ~MEM_Dyn;
  if( pTo->flags&(MEM_Str|MEM_Blob) ){
    if( 0==(pFrom->flags&MEM_Static) ){
      pTo->flags |= MEM_Ephem;
      rc = sqlite3VdbeMemMakeWriteable(pTo);
    }
  }

  return rc;
}